

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

int __thiscall QFutureInterfaceBase::progressMaximum(QFutureInterfaceBase *this)

{
  ProgressData *pPVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&this->d->m_mutex);
  pPVar1 = (this->d->m_progress).d;
  if (pPVar1 == (ProgressData *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = pPVar1->maximum;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFutureInterfaceBase::progressMaximum() const
{
    const QMutexLocker lock(&d->m_mutex);
    return d->m_progress ? d->m_progress->maximum : 0;
}